

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_scene.hpp
# Opt level: O2

hit_list<double> * mesh_scene(void)

{
  vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_> *this;
  hit_list<double> *in_RDI;
  undefined1 local_9c [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  undefined8 local_78;
  undefined4 local_70;
  int local_6c;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  value_type local_48;
  value_type local_38;
  
  (in_RDI->super_hit<double>)._vptr_hit = (_func_int **)&PTR_is_hit_0010f8d8;
  (in_RDI->obj_list).
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->obj_list).
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->obj_list).
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88 = (element_type *)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc08f400000000000;
  local_78 = 0;
  local_9c._0_4_ = 1000;
  std::make_shared<diffuse<double>,std::shared_ptr<checker<double>>&>
            ((shared_ptr<checker<double>_> *)(local_9c + 4));
  std::make_shared<sphere<double>,vec3<double>,int,std::shared_ptr<diffuse<double>>>
            ((vec3<double> *)local_68,(int *)&local_88,(shared_ptr<diffuse<double>_> *)local_9c);
  this = &in_RDI->obj_list;
  local_38.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68._0_8_;
  local_38.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
  local_68._0_8_ = (element_type *)0x0;
  local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>::
  push_back(this,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  local_9c._4_4_ = 0xfffffea9;
  local_9c._0_4_ = 0x157;
  local_6c = -0x14c;
  local_70 = 0x14c;
  local_68._0_8_ = (element_type *)0x408125999999999a;
  std::
  make_shared<xz_rectangle<double>,int,int,int,int,double,std::shared_ptr<diffuse_light<double>>&>
            ((int *)&local_88,(int *)(local_9c + 4),(int *)local_9c,&local_6c,(double *)&local_70,
             (shared_ptr<diffuse_light<double>_> *)local_68);
  local_48.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
  local_48.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_80._M_pi;
  local_88 = (element_type *)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>::
  push_back(this,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
  std::make_shared<mesh<double>,char_const(&)[10],std::shared_ptr<diffuse<double>>&>
            ((char (*) [10])&local_88,(shared_ptr<diffuse<double>_> *)"bunny.obj");
  local_68._16_8_ = local_88;
  _Stack_50._M_pi = _Stack_80._M_pi;
  local_88 = (element_type *)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>::
  push_back(this,(value_type *)(local_68 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
  return in_RDI;
}

Assistant:

hit_list<datatype> mesh_scene() {
  hit_list<datatype> objects;

  objects.add(std::make_shared<sphere<datatype>>(
      point3<datatype>(0, -1000, 0), 1000,
      std::make_shared<diffuse<datatype>>(mat_checker)));

  objects.add(std::make_shared<xz_rectangle<datatype>>(-343, 343, -332, 332,
                                                       548.7, light));
  objects.add(std::make_shared<mesh<datatype>>("bunny.obj", red));

  return objects;
}